

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

bool __thiscall OpenMD::MoleculeStamp::isBondInSameRigidBody(MoleculeStamp *this,BondStamp *bond)

{
  bool bVar1;
  int rbB;
  int rbA;
  int consAtomB;
  int consAtomA;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  bVar1 = isAtomInRigidBody(this,bond->a,&local_1c,&local_14);
  if ((bVar1) && (bVar1 = isAtomInRigidBody(this,bond->b,&local_20,&local_18), bVar1)) {
    return local_20 == local_1c;
  }
  return false;
}

Assistant:

bool MoleculeStamp::isBondInSameRigidBody(BondStamp* bond) {
    int rbA;
    int rbB;
    int consAtomA;
    int consAtomB;

    if (!isAtomInRigidBody(bond->getA(), rbA, consAtomA)) return false;

    if (!isAtomInRigidBody(bond->getB(), rbB, consAtomB)) return false;

    if (rbB == rbA)
      return true;
    else
      return false;
  }